

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlAddPrevSibling(xmlNodePtr cur,xmlNodePtr elem)

{
  xmlChar *pxVar1;
  xmlNodePtr pxVar2;
  xmlChar *tmp;
  xmlNodePtr elem_local;
  xmlNodePtr cur_local;
  
  if ((cur == (xmlNodePtr)0x0) || (cur->type == XML_NAMESPACE_DECL)) {
    cur_local = (xmlNodePtr)0x0;
  }
  else if ((elem == (xmlNodePtr)0x0) || (elem->type == XML_NAMESPACE_DECL)) {
    cur_local = (xmlNodePtr)0x0;
  }
  else if (cur == elem) {
    cur_local = (xmlNodePtr)0x0;
  }
  else {
    xmlUnlinkNode(elem);
    if (elem->type == XML_TEXT_NODE) {
      if (cur->type == XML_TEXT_NODE) {
        pxVar1 = xmlStrdup(elem->content);
        pxVar1 = xmlStrcat(pxVar1,cur->content);
        xmlNodeSetContent(cur,pxVar1);
        (*xmlFree)(pxVar1);
        xmlFreeNode(elem);
        return cur;
      }
      if (((cur->prev != (_xmlNode *)0x0) && (cur->prev->type == XML_TEXT_NODE)) &&
         (cur->name == cur->prev->name)) {
        xmlNodeAddContent(cur->prev,elem->content);
        xmlFreeNode(elem);
        return cur->prev;
      }
    }
    else if (elem->type == XML_ATTRIBUTE_NODE) {
      pxVar2 = xmlAddPropSibling(cur->prev,cur,elem);
      return pxVar2;
    }
    if (elem->doc != cur->doc) {
      xmlSetTreeDoc(elem,cur->doc);
    }
    elem->parent = cur->parent;
    elem->next = cur;
    elem->prev = cur->prev;
    cur->prev = elem;
    if (elem->prev != (_xmlNode *)0x0) {
      elem->prev->next = elem;
    }
    cur_local = elem;
    if ((elem->parent != (_xmlNode *)0x0) && (elem->parent->children == cur)) {
      elem->parent->children = elem;
    }
  }
  return cur_local;
}

Assistant:

xmlNodePtr
xmlAddPrevSibling(xmlNodePtr cur, xmlNodePtr elem) {
    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddPrevSibling : cur == NULL\n");
#endif
	return(NULL);
    }
    if ((elem == NULL) || (elem->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddPrevSibling : elem == NULL\n");
#endif
	return(NULL);
    }

    if (cur == elem) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddPrevSibling : cur == elem\n");
#endif
	return(NULL);
    }

    xmlUnlinkNode(elem);

    if (elem->type == XML_TEXT_NODE) {
	if (cur->type == XML_TEXT_NODE) {
	    xmlChar *tmp;

	    tmp = xmlStrdup(elem->content);
	    tmp = xmlStrcat(tmp, cur->content);
	    xmlNodeSetContent(cur, tmp);
	    xmlFree(tmp);
	    xmlFreeNode(elem);
	    return(cur);
	}
	if ((cur->prev != NULL) && (cur->prev->type == XML_TEXT_NODE) &&
            (cur->name == cur->prev->name)) {
	    xmlNodeAddContent(cur->prev, elem->content);
	    xmlFreeNode(elem);
	    return(cur->prev);
	}
    } else if (elem->type == XML_ATTRIBUTE_NODE) {
		return xmlAddPropSibling(cur->prev, cur, elem);
    }

    if (elem->doc != cur->doc) {
	xmlSetTreeDoc(elem, cur->doc);
    }
    elem->parent = cur->parent;
    elem->next = cur;
    elem->prev = cur->prev;
    cur->prev = elem;
    if (elem->prev != NULL)
	elem->prev->next = elem;
    if ((elem->parent != NULL) && (elem->parent->children == cur)) {
		elem->parent->children = elem;
    }
    return(elem);
}